

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O1

bool google::protobuf::compiler::ruby::MaybeEmitDependency
               (FileDescriptor *import,FileDescriptor *from,Printer *printer,string *error)

{
  bool bVar1;
  bool bVar2;
  LogMessage *pLVar3;
  long lVar4;
  long lVar5;
  LogFinisher local_89;
  string local_88;
  undefined1 local_68 [56];
  
  if (*(int *)(import + 0x8c) == 2) {
    bVar1 = 0 < *(int *)(from + 0x58);
    if (0 < *(int *)(from + 0x58)) {
      bVar2 = UsesTypeFromFile(*(Descriptor **)(from + 0x60),import,error);
      if (!bVar2) {
        lVar5 = 0;
        lVar4 = 0xa8;
        do {
          lVar5 = lVar5 + 1;
          bVar1 = lVar5 < *(int *)(from + 0x58);
          if (*(int *)(from + 0x58) <= lVar5) goto LAB_0024a6c5;
          bVar2 = UsesTypeFromFile((Descriptor *)(lVar4 + *(long *)(from + 0x60)),import,error);
          lVar4 = lVar4 + 0xa8;
        } while (!bVar2);
      }
      if (bVar1) {
        return false;
      }
    }
LAB_0024a6c5:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/ruby/ruby_generator.cc"
               ,0x1a8);
    pLVar3 = internal::LogMessage::operator<<
                       ((LogMessage *)local_68,"Omitting proto2 dependency \'");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,*(string **)import);
    pLVar3 = internal::LogMessage::operator<<(pLVar3,"\' from proto3 output file \'");
    GetOutputFilename(&local_88,*(string **)from);
    pLVar3 = internal::LogMessage::operator<<(pLVar3,&local_88);
    pLVar3 = internal::LogMessage::operator<<
                       (pLVar3,
                        "\' because we don\'t support proto2 and no proto2 types from that file are being used."
                       );
    internal::LogFinisher::operator=(&local_89,pLVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    internal::LogMessage::~LogMessage((LogMessage *)local_68);
  }
  else {
    GetRequireName((string *)local_68,*(string **)import);
    io::Printer::Print(printer,"require \'$name$\'\n","name",(string *)local_68);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
  }
  return true;
}

Assistant:

bool MaybeEmitDependency(const FileDescriptor* import,
                         const FileDescriptor* from,
                         io::Printer* printer,
                         string* error) {
  if (import->syntax() == FileDescriptor::SYNTAX_PROTO2) {
    for (int i = 0; i < from->message_type_count(); i++) {
      if (UsesTypeFromFile(from->message_type(i), import, error)) {
        // Error text was already set by UsesTypeFromFile().
        return false;
      }
    }

    // Ok to omit this proto2 dependency -- so we won't print anything.
    GOOGLE_LOG(WARNING) << "Omitting proto2 dependency '" << import->name()
                        << "' from proto3 output file '"
                        << GetOutputFilename(from->name())
                        << "' because we don't support proto2 and no proto2 "
                           "types from that file are being used.";
    return true;
  } else {
    printer->Print(
      "require '$name$'\n", "name", GetRequireName(import->name()));
    return true;
  }
}